

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O2

void __thiscall llvm::APInt::lshrInPlace(APInt *this,uint ShiftAmt)

{
  uint uVar1;
  
  uVar1 = this->BitWidth;
  if (uVar1 < ShiftAmt) {
    __assert_fail("ShiftAmt <= BitWidth && \"Invalid shift amount\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                  ,0x3d2,"void llvm::APInt::lshrInPlace(unsigned int)");
  }
  if (uVar1 < 0x41) {
    if (uVar1 == ShiftAmt) {
      (this->U).VAL = 0;
      return;
    }
    (this->U).VAL = (this->U).VAL >> ((byte)ShiftAmt & 0x3f);
    return;
  }
  tcShiftRight((this->U).pVal,(uint)((ulong)this->BitWidth + 0x3f >> 6),ShiftAmt);
  return;
}

Assistant:

void lshrInPlace(unsigned ShiftAmt) {
    assert(ShiftAmt <= BitWidth && "Invalid shift amount");
    if (isSingleWord()) {
      if (ShiftAmt == BitWidth)
        U.VAL = 0;
      else
        U.VAL >>= ShiftAmt;
      return;
    }
    lshrSlowCase(ShiftAmt);
  }